

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_init_fixed(nk_context *ctx,void *memory,nk_size size,nk_user_font *font)

{
  nk_user_font *font_local;
  nk_size size_local;
  void *memory_local;
  nk_context *ctx_local;
  
  if (memory == (void *)0x0) {
    __assert_fail("memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3a92,
                  "int nk_init_fixed(struct nk_context *, void *, nk_size, const struct nk_user_font *)"
                 );
  }
  if (memory != (void *)0x0) {
    nk_setup(ctx,font);
    nk_buffer_init_fixed(&ctx->memory,memory,size);
    ctx->use_pool = 0;
  }
  ctx_local._4_4_ = (uint)(memory != (void *)0x0);
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_init_fixed(struct nk_context *ctx, void *memory, nk_size size,
    const struct nk_user_font *font)
{
    NK_ASSERT(memory);
    if (!memory) return 0;
    nk_setup(ctx, font);
    nk_buffer_init_fixed(&ctx->memory, memory, size);
    ctx->use_pool = nk_false;
    return 1;
}